

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.cpp
# Opt level: O2

int __thiscall dlib::file::init(file *this,EVP_PKEY_CTX *ctx)

{
  string *psVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  file_not_found *pfVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10d8;
  stat64 buffer;
  char buf [4096];
  
  pcVar3 = realpath(*(char **)ctx,buf);
  if (pcVar3 == (char *)0x0) {
    pfVar5 = (file_not_found *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                   "Unable to find file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx);
    file_not_found::file_not_found(pfVar5,(string *)&buffer);
    __cxa_throw(pfVar5,&file_not_found::typeinfo,error::~error);
  }
  psVar1 = &(this->state).full_name;
  std::__cxx11::string::assign((char *)psVar1);
  lVar4 = std::__cxx11::string::rfind((char)psVar1,0x2f);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)&buffer,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)&(this->state).name,(string *)&buffer);
    std::__cxx11::string::~string((string *)&buffer);
    iVar2 = stat64((this->state).full_name._M_dataplus._M_p,(stat64 *)&buffer);
    if ((iVar2 == 0) && ((buffer.st_mode & 0xf000) != 0x4000)) {
      (this->state).file_size = buffer.st_size;
      (this->state).last_modified.__d.__r = buffer.st_mtim.tv_sec * 1000000000;
      return (int)(buffer.st_mtim.tv_sec * 1000000000);
    }
    pfVar5 = (file_not_found *)__cxa_allocate_exception(0x30);
    std::operator+(&bStack_10d8,"Unable to find file ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx);
    file_not_found::file_not_found(pfVar5,&bStack_10d8);
    __cxa_throw(pfVar5,&file_not_found::typeinfo,error::~error);
  }
  pfVar5 = (file_not_found *)__cxa_allocate_exception(0x30);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                 "Unable to find file ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ctx);
  file_not_found::file_not_found(pfVar5,(string *)&buffer);
  __cxa_throw(pfVar5,&file_not_found::typeinfo,error::~error);
}

Assistant:

void file::
    init (
        const std::string& name
    )
    {
        using namespace std;



        char buf[PATH_MAX];
        if (realpath(name.c_str(),buf) == 0)
        {
            // the file was not found
            throw file_not_found("Unable to find file " + name);
        }
        state.full_name = buf;


        string::size_type pos = state.full_name.find_last_of(directory::get_separator());
        if (pos == string::npos)
        {
            // no valid full path has no separtor characters.  
            throw file_not_found("Unable to find file " + name);
        }
        state.name = state.full_name.substr(pos+1);


        // now find the size of this file
        struct stat64 buffer;
        if (::stat64(state.full_name.c_str(), &buffer) ||
            S_ISDIR(buffer.st_mode))
        {
            // there was an error during the call to stat64 or
            // name is actually a directory
            throw file_not_found("Unable to find file " + name);
        }
        else
        {
            state.file_size = static_cast<uint64>(buffer.st_size);


            state.last_modified = std::chrono::system_clock::from_time_t(buffer.st_mtime);
#ifdef _BSD_SOURCE 
            state.last_modified += std::chrono::nanoseconds(buffer.st_atim.tv_nsec);
#endif
        }

    }